

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

uint GetArgumentOffset(FunctionData *data,uint argument)

{
  ArgumentData *pAVar1;
  uint local_20;
  uint local_1c;
  uint size;
  uint i;
  uint offset;
  uint argument_local;
  FunctionData *data_local;
  
  size = 0;
  for (local_1c = 0; local_1c < argument; local_1c = local_1c + 1) {
    pAVar1 = SmallArray<ArgumentData,_4U>::operator[](&data->arguments,local_1c);
    local_20 = (uint)pAVar1->type->size;
    if ((local_20 != 0) && (local_20 < 4)) {
      local_20 = 4;
    }
    size = local_20 + size;
  }
  return size;
}

Assistant:

unsigned GetArgumentOffset(FunctionData *data, unsigned argument)
{
	// Start at context
	unsigned offset = 0;

	for(unsigned i = 0; i < argument; i++)
	{
		unsigned size = unsigned(data->arguments[i].type->size);

		if(size != 0 && size < 4)
			size = 4;

		offset += size;
	}

	return offset;
}